

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

int sendPacketItem(MQTT_CLIENT *mqtt_client,uchar *data,size_t length)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  iVar1 = xio_send(mqtt_client->xioHandle,data,length,sendComplete,mqtt_client);
  if (iVar1 == 0) {
    iVar1 = tickcounter_get_current_ms(mqtt_client->packetTickCntr,&mqtt_client->packetSendTimeMs);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x195;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x195;
    }
    pcVar4 = "Failure getting current ms tickcounter";
    iVar3 = 0x194;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x18a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x18a;
    }
    pcVar4 = "Failure sending control packet data";
    iVar3 = 0x189;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
            ,"sendPacketItem",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int sendPacketItem(MQTT_CLIENT* mqtt_client, const unsigned char* data, size_t length)
{
    int result = xio_send(mqtt_client->xioHandle, (const void*)data, length, sendComplete, mqtt_client);

    if (result != 0)
    {
        LogError("Failure sending control packet data");
        result = MU_FAILURE;
    }
    else
    {
#ifdef ENABLE_RAW_TRACE
        logOutgoingRawTrace(mqtt_client, (const uint8_t*)data, length);
#endif

        if (tickcounter_get_current_ms(mqtt_client->packetTickCntr, &mqtt_client->packetSendTimeMs) != 0)
        {
            LogError("Failure getting current ms tickcounter");
            result = MU_FAILURE;
        }
    }

    return result;
}